

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingCompressionState<int,_true,_int>::CreateEmptySegment
          (BitpackingCompressionState<int,_true,_int> *this,idx_t row_start)

{
  BufferHandle *this_00;
  CompressionFunction *function;
  undefined8 __p;
  DatabaseInstance *db;
  LogicalType *type;
  idx_t iVar1;
  BufferManager *pBVar2;
  pointer pCVar3;
  data_ptr_t pdVar4;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  compressed_segment;
  undefined1 local_58 [40];
  
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  function = this->function;
  local_58._8_8_ = &(this->super_CompressionState).info;
  iVar1 = CompressionInfo::GetBlockSize((CompressionInfo *)local_58._8_8_);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)local_58,db,function,type,row_start,iVar1,
             (this->super_CompressionState).info.block_manager);
  __p = local_58._0_8_;
  local_58._0_8_ =
       (__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->current_segment,(pointer)__p);
  pBVar2 = BufferManager::GetBufferManager(db);
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  (*pBVar2->_vptr_BufferManager[7])(local_58 + 0x10,pBVar2,&pCVar3->block);
  this_00 = &this->handle;
  BufferHandle::operator=(this_00,(BufferHandle *)(local_58 + 0x10));
  BufferHandle::~BufferHandle((BufferHandle *)(local_58 + 0x10));
  pdVar4 = BufferHandle::Ptr(this_00);
  this->data_ptr = pdVar4 + 8;
  pdVar4 = BufferHandle::Ptr(this_00);
  iVar1 = CompressionInfo::GetBlockSize((CompressionInfo *)local_58._8_8_);
  this->metadata_ptr = pdVar4 + iVar1;
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             local_58);
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start,
		                                                                info.GetBlockSize(), info.GetBlockManager());
		current_segment = std::move(compressed_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(db);
		handle = buffer_manager.Pin(current_segment->block);

		data_ptr = handle.Ptr() + BitpackingPrimitives::BITPACKING_HEADER_SIZE;
		metadata_ptr = handle.Ptr() + info.GetBlockSize();
	}